

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O1

int x509_store_add(X509_STORE *ctx,void *x,int is_crl)

{
  OPENSSL_STACK *sk;
  int iVar1;
  X509_OBJECT *a;
  size_t sVar2;
  X509_OBJECT *a_00;
  uint uVar3;
  ulong i;
  X509_OBJECT *pXVar4;
  bool bVar5;
  size_t idx;
  ulong local_38;
  
  uVar3 = 0;
  if ((x != (void *)0x0) && (a = (X509_OBJECT *)OPENSSL_zalloc(0x10), a != (X509_OBJECT *)0x0)) {
    a->type = 2 - (uint)(is_crl == 0);
    (a->data).ptr = (char *)x;
    X509_OBJECT_up_ref_count(a);
    CRYPTO_MUTEX_lock_write(&ctx->objs_lock);
    sk = (OPENSSL_STACK *)ctx->objs;
    OPENSSL_sk_sort(sk,sk_X509_OBJECT_call_cmp_func);
    iVar1 = OPENSSL_sk_find(sk,&local_38,a,sk_X509_OBJECT_call_cmp_func);
    if (iVar1 == 0) {
      a_00 = (X509_OBJECT *)0x0;
    }
    else if (a->type - 1U < 2) {
      sVar2 = OPENSSL_sk_num(sk);
      i = local_38;
      pXVar4 = (X509_OBJECT *)sk_X509_OBJECT_call_cmp_func;
      if (local_38 < sVar2) {
        do {
          a_00 = (X509_OBJECT *)OPENSSL_sk_value(sk,i);
          iVar1 = x509_object_cmp(a_00,(X509_OBJECT *)a);
          if (iVar1 == 0) {
            if (a->type == 2) {
              iVar1 = X509_CRL_match((X509_CRL *)(a_00->data).x509,(a->data).crl);
LAB_004b58b8:
              if (iVar1 != 0) {
                bVar5 = true;
                a_00 = pXVar4;
                goto LAB_004b58c5;
              }
            }
            else if (a->type == 1) {
              iVar1 = X509_cmp((X509 *)(a_00->data).x509,(a->data).x509);
              goto LAB_004b58b8;
            }
            bVar5 = false;
          }
          else {
            bVar5 = false;
            a_00 = (X509_OBJECT *)0x0;
          }
LAB_004b58c5:
          if (!bVar5) goto LAB_004b58f6;
          i = i + 1;
          sVar2 = OPENSSL_sk_num(sk);
          pXVar4 = a_00;
        } while (i < sVar2);
      }
      a_00 = (X509_OBJECT *)0x0;
    }
    else {
      a_00 = (X509_OBJECT *)OPENSSL_sk_value(sk,local_38);
    }
LAB_004b58f6:
    if (a_00 == (X509_OBJECT *)0x0) {
      sVar2 = OPENSSL_sk_push((OPENSSL_STACK *)ctx->objs,a);
      bVar5 = sVar2 == 0;
      uVar3 = (uint)!bVar5;
    }
    else {
      bVar5 = true;
      uVar3 = 1;
    }
    CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);
    if (bVar5) {
      X509_OBJECT_free_contents(a);
      OPENSSL_free(a);
    }
  }
  return uVar3;
}

Assistant:

static int x509_store_add(X509_STORE *ctx, void *x, int is_crl) {
  if (x == NULL) {
    return 0;
  }

  X509_OBJECT *const obj = X509_OBJECT_new();
  if (obj == NULL) {
    return 0;
  }

  if (is_crl) {
    obj->type = X509_LU_CRL;
    obj->data.crl = (X509_CRL *)x;
  } else {
    obj->type = X509_LU_X509;
    obj->data.x509 = (X509 *)x;
  }
  X509_OBJECT_up_ref_count(obj);

  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);

  int ret = 1;
  int added = 0;
  // Duplicates are silently ignored
  if (!X509_OBJECT_retrieve_match(ctx->objs, obj)) {
    ret = added = (sk_X509_OBJECT_push(ctx->objs, obj) != 0);
  }

  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (!added) {
    X509_OBJECT_free(obj);
  }

  return ret;
}